

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-mmap.cpp
# Opt level: O0

void __thiscall llama_file::impl::read_raw(impl *this,void *ptr,size_t len)

{
  int iVar1;
  int *piVar2;
  runtime_error *prVar3;
  char *pcVar4;
  size_t in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  size_t ret;
  string local_40 [32];
  size_t local_20;
  size_t local_18;
  void *local_10;
  
  if (in_RDX != 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    piVar2 = __errno_location();
    *piVar2 = 0;
    local_20 = fread(local_10,local_18,1,(FILE *)*in_RDI);
    iVar1 = ferror((FILE *)*in_RDI);
    if (iVar1 != 0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      format_abi_cxx11_((char *)local_40,"read error: %s",pcVar4);
      std::runtime_error::runtime_error(prVar3,local_40);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_20 != 1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"unexpectedly reached end of file");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void read_raw(void * ptr, size_t len) const {
        if (len == 0) {
            return;
        }
        errno = 0;
        std::size_t ret = std::fread(ptr, len, 1, fp);
        if (ferror(fp)) {
            throw std::runtime_error(format("read error: %s", strerror(errno)));
        }
        if (ret != 1) {
            throw std::runtime_error("unexpectedly reached end of file");
        }
    }